

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<duckdb::uhugeint_t>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  uint64_t uVar1;
  uhugeint_t constant;
  FilterPropagateResult FVar2;
  Value *this_00;
  Value *pVVar3;
  undefined7 in_register_00000011;
  uhugeint_t min_value;
  array_ptr_iterator<duckdb::Value> __begin2;
  uint64_t uVar4;
  uint64_t uVar5;
  array_ptr_iterator<duckdb::Value> local_58;
  uhugeint_t local_40;
  
  pVVar3 = constants.ptr;
  uVar5 = *(uint64_t *)(this + 0x30);
  uVar4 = *(uint64_t *)(this + 0x38);
  uVar1 = *(uint64_t *)(this + 0x40);
  local_58.index = 0;
  local_58.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
  local_58.size = (idx_t)pVVar3;
  while( true ) {
    if ((Value *)local_58.size == pVVar3 &&
        ((Value *)local_58.index == pVVar3 &&
        local_58.ptr == (Value *)CONCAT71(in_register_00000011,comparison_type))) {
      return FILTER_ALWAYS_FALSE;
    }
    this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_58);
    local_40 = Value::GetValueUnsafe<duckdb::uhugeint_t>(this_00);
    constant.upper = uVar5;
    constant.lower = uVar4;
    min_value.upper = uVar1;
    min_value.lower = uVar4;
    FVar2 = CheckZonemapTemplated<duckdb::uhugeint_t>
                      (this,(BaseStatistics *)((ulong)stats & 0xff),(ExpressionType)uVar5,min_value,
                       local_40,constant);
    if (FVar2 < FILTER_ALWAYS_FALSE) break;
    local_58.index = (idx_t)&((LogicalType *)local_58.index)->physical_type_;
    if (local_58.size <= local_58.index) {
      local_58.index = local_58.size;
    }
  }
  return FVar2;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type,
                                            array_ptr<Value> constants) {
	T min_value = NumericStats::GetMinUnsafe<T>(stats);
	T max_value = NumericStats::GetMaxUnsafe<T>(stats);
	for (auto &constant_value : constants) {
		D_ASSERT(constant_value.type() == stats.GetType());
		D_ASSERT(!constant_value.IsNull());
		T constant = constant_value.GetValueUnsafe<T>();
		auto prune_result = CheckZonemapTemplated(stats, comparison_type, min_value, max_value, constant);
		if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
	}
	return FilterPropagateResult::FILTER_ALWAYS_FALSE;
}